

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O3

int mdns_string_equal(void *buffer_lhs,size_t size_lhs,size_t *ofs_lhs,void *buffer_rhs,
                     size_t size_rhs,size_t *ofs_rhs)

{
  size_t sVar1;
  size_t sVar2;
  size_t __n;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  size_t offset;
  mdns_string_pair_t local_78;
  size_t *local_60;
  size_t *local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  sVar6 = *ofs_lhs;
  offset = *ofs_rhs;
  local_38 = 0xffffffffffffffff;
  local_40 = 0xffffffffffffffff;
  local_60 = ofs_lhs;
  local_58 = ofs_rhs;
  local_50 = size_lhs;
  local_48 = size_rhs;
  while( true ) {
    mdns_get_next_substring(&local_78,buffer_lhs,local_50,sVar6);
    iVar3 = local_78.ref;
    __n = local_78.length;
    sVar1 = local_78.offset;
    mdns_get_next_substring(&local_78,buffer_rhs,local_48,offset);
    iVar4 = local_78.ref;
    sVar2 = local_78.offset;
    if (sVar1 == 0xffffffffffffffff) {
      return 0;
    }
    if (local_78.offset == 0xffffffffffffffff) {
      return 0;
    }
    if (__n != local_78.length) {
      return 0;
    }
    iVar5 = strncasecmp((char *)((long)buffer_rhs + local_78.offset),
                        (char *)((long)buffer_lhs + sVar1),__n);
    if (iVar5 != 0) break;
    sVar6 = sVar6 + 2;
    if (local_40 != 0xffffffffffffffff) {
      sVar6 = local_40;
    }
    if (iVar3 != 0) {
      local_40 = sVar6;
    }
    sVar6 = offset + 2;
    if (local_38 != 0xffffffffffffffff) {
      sVar6 = local_38;
    }
    if (iVar4 != 0) {
      local_38 = sVar6;
    }
    sVar6 = sVar1 + __n;
    offset = sVar2 + __n;
    if (__n == 0) {
      sVar6 = sVar6 + 1;
      if (local_40 != 0xffffffffffffffff) {
        sVar6 = local_40;
      }
      *local_60 = sVar6;
      sVar6 = offset + 1;
      if (local_38 != 0xffffffffffffffff) {
        sVar6 = local_38;
      }
      *local_58 = sVar6;
      return 1;
    }
  }
  return 0;
}

Assistant:

int
mdns_string_equal(const void* buffer_lhs, size_t size_lhs, size_t* ofs_lhs,
                  const void* buffer_rhs, size_t size_rhs, size_t* ofs_rhs) {
	size_t lhs_cur = *ofs_lhs;
	size_t rhs_cur = *ofs_rhs;
	size_t lhs_end = MDNS_INVALID_POS;
	size_t rhs_end = MDNS_INVALID_POS;
	mdns_string_pair_t lhs_substr;
	mdns_string_pair_t rhs_substr;
	do {
		lhs_substr = mdns_get_next_substring(buffer_lhs, size_lhs, lhs_cur);
		rhs_substr = mdns_get_next_substring(buffer_rhs, size_rhs, rhs_cur);
		if ((lhs_substr.offset == MDNS_INVALID_POS) || (rhs_substr.offset == MDNS_INVALID_POS))
			return 0;
		if (lhs_substr.length != rhs_substr.length)
			return 0;
		if (strncasecmp((const char*)buffer_rhs + rhs_substr.offset,
		                (const char*)buffer_lhs + lhs_substr.offset, rhs_substr.length))
			return 0;
		if (lhs_substr.ref && (lhs_end == MDNS_INVALID_POS))
			lhs_end = lhs_cur + 2;
		if (rhs_substr.ref && (rhs_end == MDNS_INVALID_POS))
			rhs_end = rhs_cur + 2;
		lhs_cur = lhs_substr.offset + lhs_substr.length;
		rhs_cur = rhs_substr.offset + rhs_substr.length;
	}
	while (lhs_substr.length);

	if (lhs_end == MDNS_INVALID_POS)
		lhs_end = lhs_cur + 1;
	*ofs_lhs = lhs_end;

	if (rhs_end == MDNS_INVALID_POS)
		rhs_end = rhs_cur + 1;
	*ofs_rhs = rhs_end;

	return 1;
}